

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

int FFSconsume_next_item(FFSFile ffsfile)

{
  FFSRecordType FVar1;
  FFSBuffer p_Var2;
  FFSFile ffsfile_00;
  long in_RDI;
  void *unaff_retaddr;
  FFSFile in_stack_000000a8;
  int local_4;
  
  FVar1 = next_record_type(in_stack_000000a8);
  ffsfile_00 = (FFSFile)(ulong)(FVar1 - FFSdata);
  switch(ffsfile_00) {
  case (FFSFile)0x0:
    if (*(long *)(in_RDI + 0x18) == 0) {
      p_Var2 = create_FFSBuffer();
      *(FFSBuffer *)(in_RDI + 0x18) = p_Var2;
    }
    FFSread(ffsfile,unaff_retaddr);
    next_record_type(in_stack_000000a8);
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case (FFSFile)0x4:
    FFSread_format(ffsfile);
    next_record_type(in_stack_000000a8);
    local_4 = 1;
    break;
  case (FFSFile)0xc:
    if (*(long *)(in_RDI + 0x18) == 0) {
      p_Var2 = create_FFSBuffer();
      *(FFSBuffer *)(in_RDI + 0x18) = p_Var2;
    }
    FFSread_comment(ffsfile_00);
    next_record_type(in_stack_000000a8);
    local_4 = 1;
    break;
  case (FFSFile)0x1c:
    FFSread_index(ffsfile);
    next_record_type(in_stack_000000a8);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
FFSconsume_next_item(FFSFile ffsfile)
{
    switch(next_record_type(ffsfile)) {
    case FFScomment:
	if (ffsfile->tmp_buffer == NULL) {
	    ffsfile->tmp_buffer = create_FFSBuffer();
	}
	(void) FFSread_comment(ffsfile);
	(void) next_record_type(ffsfile);
	return 1;
    case FFSdata:
	if (ffsfile->tmp_buffer == NULL) {
	    ffsfile->tmp_buffer = create_FFSBuffer();
	}
	(void) FFSread(ffsfile, NULL);
	(void) next_record_type(ffsfile);
	return 1;
    case FFSformat:
	(void) FFSread_format(ffsfile);
	(void) next_record_type(ffsfile);
	return 1;
    case FFSindex:
	(void) FFSread_index(ffsfile);
	(void) next_record_type(ffsfile);
	return 1;
    default:
	return 0;
    }
}